

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::BinaryRegistryWriter
          (BinaryRegistryWriter *this,string *dstPath)

{
  bool bVar1;
  FilePath local_40;
  
  this->m_dstPath = dstPath;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BinaryIndexHash::BinaryIndexHash(&this->m_binaryHash);
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)dstPath);
  bVar1 = de::FilePath::exists(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    initFromPath(this,dstPath);
  }
  return;
}

Assistant:

BinaryRegistryWriter::BinaryRegistryWriter (const std::string& dstPath)
	: m_dstPath(dstPath)
{
	if (de::FilePath(dstPath).exists())
		initFromPath(dstPath);
}